

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26dba::TestNotifiesReporterOfTestEnd::TestNotifiesReporterOfTestEnd
          (TestNotifiesReporterOfTestEnd *this)

{
  char *suiteName;
  TestNotifiesReporterOfTestEnd *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"NotifiesReporterOfTestEnd",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestTestResults.cpp"
             ,0x62);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestNotifiesReporterOfTestEnd_00184ec0;
  return;
}

Assistant:

TEST(NotifiesReporterOfTestEnd)
{
    RecordingReporter reporter;
    TestResults results(&reporter);

    results.OnTestFinish(details, 0.1234f);
    CHECK_EQUAL (1, reporter.testFinishedCount);
    CHECK_EQUAL ("testname", reporter.lastFinishedTest);
    CHECK_EQUAL ("suitename", reporter.lastFinishedSuite);
    CHECK_CLOSE (0.1234f, reporter.lastFinishedTestTime, 0.0001f);
}